

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

int matchpattern(regex_t *pattern,char *text)

{
  byte bVar1;
  char cVar2;
  anon_union_8_2_c9599718_for_regex_t_1 aVar3;
  int iVar4;
  ulong uVar5;
  regex_t p;
  regex_t p_00;
  regex_t p_01;
  regex_t p_02;
  
  do {
    uVar5 = (ulong)pattern->type;
    pattern = pattern + 2;
    while( true ) {
      if ((char)uVar5 == '\0') {
        return 1;
      }
      bVar1 = pattern[-1].type;
      if (bVar1 == 6) {
        aVar3 = (anon_union_8_2_c9599718_for_regex_t_1)pattern[-2].field_1.ccl;
        while( true ) {
          if (*text == '\0') {
            return 0;
          }
          p_01.field_1 = (anon_union_8_2_c9599718_for_regex_t_1)
                         (anon_union_8_2_c9599718_for_regex_t_1)aVar3.ccl;
          p_01._0_8_ = uVar5;
          iVar4 = matchone(p_01,*text);
          if (iVar4 == 0) break;
          iVar4 = matchpattern(pattern,text + 1);
          text = text + 1;
          if (iVar4 != 0) {
            return 1;
          }
        }
        return 0;
      }
      if (bVar1 == 5) {
        aVar3 = (anon_union_8_2_c9599718_for_regex_t_1)pattern[-2].field_1.ccl;
        while( true ) {
          iVar4 = matchpattern(pattern,text);
          if (iVar4 != 0) {
            return 1;
          }
          cVar2 = *text;
          if (cVar2 == '\0') break;
          text = text + 1;
          p_02.field_1 = (anon_union_8_2_c9599718_for_regex_t_1)
                         (anon_union_8_2_c9599718_for_regex_t_1)aVar3.ccl;
          p_02._0_8_ = uVar5;
          iVar4 = matchone(p_02,cVar2);
          if (iVar4 == 0) {
            return 0;
          }
        }
        return 0;
      }
      if (bVar1 == 4) break;
      cVar2 = *text;
      if ((char)uVar5 == '\x03' && bVar1 == 0) {
        return (uint)(cVar2 == '\0');
      }
      if (cVar2 == '\0') {
        return 0;
      }
      text = text + 1;
      p.field_1.ccl = pattern[-2].field_1.ccl;
      p._0_8_ = uVar5;
      iVar4 = matchone(p,cVar2);
      pattern = pattern + 1;
      uVar5 = (ulong)(uint)bVar1;
      if (iVar4 == 0) {
        return 0;
      }
    }
    aVar3 = (anon_union_8_2_c9599718_for_regex_t_1)pattern[-2].field_1.ccl;
    iVar4 = matchpattern(pattern,text);
    if (iVar4 != 0) {
      return 1;
    }
    if (*text == '\0') {
      return 0;
    }
    p_00.field_1 = (anon_union_8_2_c9599718_for_regex_t_1)
                   (anon_union_8_2_c9599718_for_regex_t_1)aVar3.ccl;
    p_00._0_8_ = uVar5;
    iVar4 = matchone(p_00,*text);
    text = text + 1;
    if (iVar4 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int matchpattern(regex_t* pattern, const char* text)
{
  do
  {
    if ((pattern[0].type == UNUSED) || (pattern[1].type == QUESTIONMARK))
    {
      return matchquestion(pattern[0], &pattern[2], text);
    }
    else if (pattern[1].type == STAR)
    {
      return matchstar(pattern[0], &pattern[2], text);
    }
    else if (pattern[1].type == PLUS)
    {
      return matchplus(pattern[0], &pattern[2], text);
    }
    else if ((pattern[0].type == END) && pattern[1].type == UNUSED)
    {
      return (text[0] == '\0');
    }
/*  Branching is not working properly
    else if (pattern[1].type == BRANCH)
    {
      return (matchpattern(pattern, text) || matchpattern(&pattern[2], text));
    }
*/
  }
  while ((text[0] != '\0') && matchone(*pattern++, *text++));

  return 0;
}